

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::free_all_blocks(jpeg_decoder *this)

{
  mem_block *pmVar1;
  mem_block *__ptr;
  
  this->m_pStream = (jpeg_decoder_stream *)0x0;
  __ptr = this->m_pMem_blocks;
  while (__ptr != (mem_block *)0x0) {
    pmVar1 = __ptr->m_pNext;
    free(__ptr);
    __ptr = pmVar1;
  }
  this->m_pMem_blocks = (mem_block *)0x0;
  return;
}

Assistant:

void jpeg_decoder::free_all_blocks()
	{
		m_pStream = nullptr;
		for (mem_block* b = m_pMem_blocks; b; )
		{
			mem_block* n = b->m_pNext;
			jpgd_free(b);
			b = n;
		}
		m_pMem_blocks = nullptr;
	}